

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkincludes.cpp
# Opt level: O1

void __thiscall network_pimpl::insert_event(network_pimpl *this,EventDataType *value)

{
  pointer pEVar1;
  int iVar2;
  ostream *poVar3;
  pointer this_00;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  string local_b8;
  string local_98;
  string local_78;
  network_pimpl *local_58;
  string local_50;
  
  this_00 = (this->events).super__Vector_base<EventDataType,_std::allocator<EventDataType>_>._M_impl
            .super__Vector_impl_data._M_start;
  pEVar1 = (this->events).super__Vector_base<EventDataType,_std::allocator<EventDataType>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_58 = this;
  do {
    bVar4 = this_00 == pEVar1;
    if (bVar4) {
LAB_0018be54:
      std::vector<EventDataType,_std::allocator<EventDataType>_>::push_back(&local_58->events,value)
      ;
      return;
    }
    EventDataType::getName_abi_cxx11_(&local_b8,this_00);
    EventDataType::getName_abi_cxx11_(&local_78,value);
    if (local_b8._M_string_length == local_78._M_string_length) {
      if (local_b8._M_string_length == 0) {
        bVar5 = true;
      }
      else {
        iVar2 = bcmp(local_b8._M_dataplus._M_p,local_78._M_dataplus._M_p,local_b8._M_string_length);
        bVar5 = iVar2 == 0;
      }
    }
    else {
      bVar5 = false;
    }
    if (bVar5) {
      EventDataType::getOrigin_abi_cxx11_(&local_98,this_00);
      EventDataType::getOrigin_abi_cxx11_(&local_50,value);
      if (local_98._M_string_length != local_50._M_string_length) goto LAB_0018bd56;
      if (local_98._M_string_length == 0) {
        bVar6 = true;
      }
      else {
        iVar2 = bcmp(local_98._M_dataplus._M_p,local_50._M_dataplus._M_p,local_98._M_string_length);
        bVar6 = iVar2 == 0;
      }
    }
    else {
LAB_0018bd56:
      bVar6 = false;
    }
    if (bVar5) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    if (bVar6) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"---duplicate event ",0x13);
      EventDataType::getName_abi_cxx11_(&local_b8,this_00);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,local_b8._M_dataplus._M_p,local_b8._M_string_length)
      ;
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      if (bVar6) {
        if (!bVar4) {
          return;
        }
        goto LAB_0018be54;
      }
    }
    this_00 = this_00 + 1;
  } while( true );
}

Assistant:

void network_pimpl::insert_event(const EventDataType &value){
    for(auto const& ev : events){
        if(ev.getName() == value.getName() && ev.getOrigin() == value.getOrigin()){
            std::cerr << "---duplicate event " << ev.getName() << "\n";
            return;
        }
    }
    events.push_back(value);
}